

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings(SimpleParallelAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *pAVar1;
  element_type *peVar2;
  AnalyzerSettingInterfaceNumberList *this_00;
  element_type *peVar3;
  reference pvVar4;
  value_type *__x;
  value_type *__x_00;
  Channel *pCVar5;
  uint uVar6;
  char local_d8 [8];
  char text_1 [64];
  uint local_90;
  uint local_8c;
  U32 i_2;
  U32 i_1;
  char text [64];
  AnalyzerSettingInterfaceChannel *local_40;
  AnalyzerSettingInterfaceChannel *data_channel_interface;
  uint local_24;
  uint local_20;
  U32 i;
  U32 count;
  SimpleParallelAnalyzerSettings *local_10;
  SimpleParallelAnalyzerSettings *this_local;
  
  local_10 = this;
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SimpleParallelAnalyzerSettings_0011ad00;
  std::vector<Channel,_std::allocator<Channel>_>::vector(&this->mDataChannels);
  Channel::Channel(&this->mClockChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mClockEdge = PosEdge;
  std::vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ::vector(&this->mDataChannelsInterface);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mClockChannelInterface,(element_type *)0x0);
  __x = (value_type *)0x0;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mClockEdgeInterface,(element_type *)0x0);
  local_20 = 0x10;
  for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
    Channel::Channel((Channel *)&data_channel_interface,0xffffffffffffffff,0xffffffff,
                     DIGITAL_CHANNEL);
    __x_00 = (value_type *)&data_channel_interface;
    std::vector<Channel,_std::allocator<Channel>_>::push_back(&this->mDataChannels,__x_00);
    Channel::~Channel((Channel *)&data_channel_interface);
    pAVar1 = (AnalyzerSettingInterfaceChannel *)
             AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)__x_00);
    AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
    local_40 = pAVar1;
    sprintf((char *)&i_2,"D%d",(ulong)local_24);
    AnalyzerSettingInterface::SetTitleAndTooltip((char *)local_40,(char *)&i_2);
    pAVar1 = local_40;
    std::vector<Channel,_std::allocator<Channel>_>::operator[](&this->mDataChannels,(ulong)local_24)
    ;
    AnalyzerSettingInterfaceChannel::SetChannel((Channel *)pAVar1);
    AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed(SUB81(local_40,0));
    __x = &local_40;
    std::
    vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>::
    push_back(&this->mDataChannelsInterface,__x);
  }
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)__x);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mClockChannelInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"Text above");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface)
  ;
  pCVar5 = &this->mClockChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar2);
  this_00 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_00);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mClockEdgeInterface,this_00);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mClockEdgeInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar3,"");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mClockEdgeInterface)
  ;
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)peVar3,"Data is valid on Clock rising edge");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mClockEdgeInterface)
  ;
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)peVar3,"Data is valid on Clock falling edge");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mClockEdgeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mClockEdge);
  for (local_8c = 0; local_8c < local_20; local_8c = local_8c + 1) {
    std::
    vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>::
    operator[](&this->mDataChannelsInterface,(ulong)local_8c);
    AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  }
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mClockChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar6 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar6,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  for (local_90 = 0; local_90 < local_20; local_90 = local_90 + 1) {
    sprintf(local_d8,"D%d",(ulong)local_90);
    pvVar4 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                       (&this->mDataChannels,(ulong)local_90);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)pvVar4,SUB81(local_d8,0));
  }
  return;
}

Assistant:

SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings()
:
	mClockChannel( UNDEFINED_CHANNEL ),
	mClockEdge( AnalyzerEnums::PosEdge )
{
	U32 count = 16;
	for( U32 i=0; i<count; i++ )
	{
		mDataChannels.push_back( UNDEFINED_CHANNEL );
		AnalyzerSettingInterfaceChannel* data_channel_interface = new AnalyzerSettingInterfaceChannel();
		
		char text[64];
		sprintf( text, "D%d", i );

		data_channel_interface->SetTitleAndTooltip( text, text );
		data_channel_interface->SetChannel( mDataChannels[i] );
		data_channel_interface->SetSelectionOfNoneIsAllowed( true );

		mDataChannelsInterface.push_back( data_channel_interface );
	}

	//The remainder of the old clock channel stuff provides a means to select
	//where the output goes in the waveform window. There is no clock anymore.
	mClockChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
	mClockChannelInterface->SetTitleAndTooltip( "Text above", "Analyzer displays output above this channel" );
	mClockChannelInterface->SetChannel( mClockChannel );

	mClockEdgeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
	mClockEdgeInterface->SetTitleAndTooltip( "", "" );
	mClockEdgeInterface->AddNumber( AnalyzerEnums::PosEdge, "Data is valid on Clock rising edge", "Data is valid on Clock rising edge" );
	mClockEdgeInterface->AddNumber( AnalyzerEnums::NegEdge, "Data is valid on Clock falling edge", "Data is valid on Clock falling edge" );
	mClockEdgeInterface->SetNumber( mClockEdge );



	for( U32 i=0; i<count; i++ )
	{
		AddInterface( mDataChannelsInterface[i] );
	}

	AddInterface( mClockChannelInterface.get() );
	//AddInterface( mClockEdgeInterface.get() ); removes clock edge from the settings page

	AddExportOption( 0, "Export as text/csv file" );
	AddExportExtension( 0, "text", "txt" );
	AddExportExtension( 0, "csv", "csv" );

	ClearChannels();
	for( U32 i=0; i<count; i++ )
	{
		char text[64];
		sprintf( text, "D%d", i );
		AddChannel( mDataChannels[i], text, false );
	}
}